

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O2

void tunnel_free(Curl_cfilter *cf,Curl_easy *data)

{
  h1_tunnel_state_conflict *ts;
  
  if ((cf != (Curl_cfilter *)0x0) &&
     (ts = (h1_tunnel_state_conflict *)cf->ctx, ts != (h1_tunnel_state_conflict *)0x0)) {
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
    Curl_dyn_free((dynbuf *)ts);
    Curl_dyn_free(&ts->request_data);
    Curl_httpchunk_free(data,&ts->ch);
    (*Curl_cfree)(ts);
    cf->ctx = (void *)0x0;
  }
  return;
}

Assistant:

static void tunnel_free(struct Curl_cfilter *cf,
                        struct Curl_easy *data)
{
  if(cf) {
    struct h1_tunnel_state *ts = cf->ctx;
    if(ts) {
      h1_tunnel_go_state(cf, ts, H1_TUNNEL_FAILED, data);
      Curl_dyn_free(&ts->rcvbuf);
      Curl_dyn_free(&ts->request_data);
      Curl_httpchunk_free(data, &ts->ch);
      free(ts);
      cf->ctx = NULL;
    }
  }
}